

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

void IDLExport::checkType(Type *type)

{
  int iVar1;
  UnsupportedType *pUVar2;
  string local_40;
  
  iVar1 = Typelib::Type::getCategory();
  if (iVar1 == 2) {
    pUVar2 = (UnsupportedType *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"pointers are not allowed in IDL","");
    Typelib::UnsupportedType::UnsupportedType(pUVar2,type,&local_40);
    __cxa_throw(pUVar2,&Typelib::UnsupportedType::typeinfo,
                Typelib::UnsupportedType::~UnsupportedType);
  }
  iVar1 = Typelib::Type::getCategory();
  if (iVar1 == 1) {
    Typelib::Indirect::getIndirection();
    iVar1 = Typelib::Type::getCategory();
    if (iVar1 - 1U < 2) {
      pUVar2 = (UnsupportedType *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"multi-dimensional arrays are not supported yet","");
      Typelib::UnsupportedType::UnsupportedType(pUVar2,type,&local_40);
      __cxa_throw(pUVar2,&Typelib::UnsupportedType::typeinfo,
                  Typelib::UnsupportedType::~UnsupportedType);
    }
  }
  return;
}

Assistant:

void IDLExport::checkType(Type const& type)
{
    if (type.getCategory() == Type::Pointer)
        throw UnsupportedType(type, "pointers are not allowed in IDL");
    if (type.getCategory() == Type::Array)
    {
        Type::Category pointed_to = static_cast<Indirect const&>(type).getIndirection().getCategory();
        if (pointed_to == Type::Array || pointed_to == Type::Pointer)
            throw UnsupportedType(type, "multi-dimensional arrays are not supported yet");
    }

}